

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line.cpp
# Opt level: O0

void __thiscall
program_options::command_line_parser::finish_option
          (command_line_parser *this,option *opt,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *other_tokens,
          vector<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_std::allocator<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>
          *style_parsers)

{
  bool bVar1;
  undefined1 approx;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  size_type sVar5;
  reference pvVar6;
  undefined8 uVar7;
  string *psVar8;
  element_type *peVar9;
  size_type sVar10;
  vector<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_std::allocator<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>
  *in_RCX;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  string *in_RSI;
  command_line_parser *in_RDI;
  error_with_option_name *e;
  option_description *od;
  uint i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  next_token;
  vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
  followed_option;
  uint present_tokens;
  uint max_tokens;
  uint min_tokens;
  option_description *d;
  option_description *xd;
  string original_token_for_exceptions;
  option_description *in_stack_fffffffffffffca8;
  undefined4 in_stack_fffffffffffffcb0;
  int in_stack_fffffffffffffcb4;
  string *in_stack_fffffffffffffcb8;
  string *in_stack_fffffffffffffcc0;
  const_iterator in_stack_fffffffffffffcc8;
  kind_t kVar11;
  invalid_command_line_syntax *in_stack_fffffffffffffcd0;
  invalid_command_line_syntax *this_00;
  iterator in_stack_fffffffffffffce0;
  string *in_stack_fffffffffffffce8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcf0;
  undefined1 in_stack_fffffffffffffd35;
  undefined1 in_stack_fffffffffffffd36;
  undefined1 in_stack_fffffffffffffd37;
  string *in_stack_fffffffffffffd38;
  undefined7 in_stack_fffffffffffffd40;
  undefined1 in_stack_fffffffffffffd47;
  undefined1 uVar12;
  string local_221;
  undefined1 local_1f9 [41];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1d0;
  undefined1 local_1ba;
  undefined8 local_170;
  undefined4 local_150;
  undefined1 local_112;
  uint local_c4;
  int local_ac;
  uint local_94;
  option_description *local_90;
  undefined1 local_82;
  undefined4 local_5c;
  option_description *local_58;
  string local_40 [32];
  vector<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_std::allocator<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>
  *local_20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_18;
  string *local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    std::__cxx11::string::string(local_40,local_10);
    sVar5 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(local_10 + 0x40));
    if (sVar5 != 0) {
      pvVar6 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)(local_10 + 0x40),0);
      std::__cxx11::string::operator=(local_40,(string *)pvVar6);
    }
    is_style_active(in_RDI,allow_guessing);
    is_style_active(in_RDI,long_case_insensitive);
    is_style_active(in_RDI,short_case_insensitive);
    local_58 = options_description::find_nothrow
                         ((options_description *)
                          CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40),
                          in_stack_fffffffffffffd38,(bool)in_stack_fffffffffffffd37,
                          (bool)in_stack_fffffffffffffd36,(bool)in_stack_fffffffffffffd35);
    if (local_58 == (option_description *)0x0) {
      if ((in_RDI->m_allow_unregistered & 1U) == 0) {
        local_82 = 1;
        uVar7 = __cxa_allocate_exception(0xb8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffcf0,(char *)in_stack_fffffffffffffce8,
                   (allocator<char> *)in_stack_fffffffffffffce0._M_current);
        unknown_option::unknown_option
                  ((unknown_option *)in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
        local_82 = 0;
        __cxa_throw(uVar7,&unknown_option::typeinfo,unknown_option::~unknown_option);
      }
      local_10[0x58] = (string)0x1;
      local_5c = 1;
    }
    else {
      local_90 = local_58;
      psVar8 = option_description::key
                         ((option_description *)in_stack_fffffffffffffcc8._M_current,
                          in_stack_fffffffffffffcc0);
      std::__cxx11::string::operator=(local_10,(string *)psVar8);
      option_description::semantic(in_stack_fffffffffffffca8);
      peVar9 = std::
               __shared_ptr_access<const_program_options::value_base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<const_program_options::value_base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x131b1c);
      uVar2 = (*peVar9->_vptr_value_base[3])();
      std::shared_ptr<const_program_options::value_base>::~shared_ptr
                ((shared_ptr<const_program_options::value_base> *)0x131b3e);
      local_94 = uVar2;
      option_description::semantic(in_stack_fffffffffffffca8);
      peVar9 = std::
               __shared_ptr_access<const_program_options::value_base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<const_program_options::value_base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x131b70);
      iVar3 = (*peVar9->_vptr_value_base[4])();
      std::shared_ptr<const_program_options::value_base>::~shared_ptr
                ((shared_ptr<const_program_options::value_base> *)0x131b92);
      local_ac = iVar3;
      sVar5 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(local_10 + 0x28));
      sVar10 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size(local_18);
      local_c4 = (int)sVar5 + (int)sVar10;
      if (local_c4 < local_94) {
        uVar7 = __cxa_allocate_exception(0xc0);
        this_00 = (invalid_command_line_syntax *)local_1f9;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffcf0,(char *)in_stack_fffffffffffffce8,
                   (allocator<char> *)in_stack_fffffffffffffce0._M_current);
        psVar8 = &local_221;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffcf0,(char *)in_stack_fffffffffffffce8,
                   (allocator<char> *)in_stack_fffffffffffffce0._M_current);
        invalid_command_line_syntax::invalid_command_line_syntax
                  (this_00,(kind_t)((ulong)uVar7 >> 0x20),psVar8,in_stack_fffffffffffffcb8,
                   in_stack_fffffffffffffcb4);
        __cxa_throw(uVar7,&invalid_command_line_syntax::typeinfo,
                    invalid_command_line_syntax::~invalid_command_line_syntax);
      }
      bVar1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffffcc0);
      if ((!bVar1) && (local_ac == 0)) {
        local_112 = 1;
        uVar7 = __cxa_allocate_exception(0xc0);
        kVar11 = (kind_t)((ulong)in_stack_fffffffffffffcc8._M_current >> 0x20);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffcf0,(char *)in_stack_fffffffffffffce8,
                   (allocator<char> *)in_stack_fffffffffffffce0._M_current);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffcf0,(char *)in_stack_fffffffffffffce8,
                   (allocator<char> *)in_stack_fffffffffffffce0._M_current);
        invalid_command_line_syntax::invalid_command_line_syntax
                  (in_stack_fffffffffffffcd0,kVar11,in_stack_fffffffffffffcc0,
                   in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb4);
        local_112 = 0;
        __cxa_throw(uVar7,&invalid_command_line_syntax::typeinfo,
                    invalid_command_line_syntax::~invalid_command_line_syntax);
      }
      sVar5 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(local_10 + 0x28));
      if (local_94 < sVar5) {
        local_94 = 0;
      }
      else {
        sVar5 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)(local_10 + 0x28));
        local_94 = local_94 - (int)sVar5;
      }
      while( true ) {
        bVar1 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffffcc0);
        uVar2 = local_94;
        if (!bVar1) {
          local_94 = local_94 + -1;
        }
        if (bVar1 || uVar2 == 0) break;
        std::
        vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
        ::vector((vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
                  *)0x131e6c);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](local_18,0);
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)0x131e9a);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffcd0,(size_type)in_stack_fffffffffffffcc8._M_current,
                 in_stack_fffffffffffffcc0,(allocator_type *)in_stack_fffffffffffffcb8);
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)0x131ecb);
        local_150 = 0;
        while( true ) {
          bVar1 = std::
                  vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
                  ::empty((vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
                           *)in_stack_fffffffffffffcc0);
          uVar12 = false;
          if (bVar1) {
            in_stack_fffffffffffffd38 = (string *)(ulong)(uint)local_150;
            psVar8 = (string *)
                     std::
                     vector<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_std::allocator<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>
                     ::size(local_20);
            uVar12 = in_stack_fffffffffffffd38 < psVar8;
          }
          if ((bool)uVar12 == false) break;
          std::
          vector<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_std::allocator<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>
          ::operator[](local_20,(ulong)(uint)local_150);
          std::
          function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
          ::operator()((function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
                        *)in_stack_fffffffffffffcc8._M_current,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_stack_fffffffffffffcc0);
          std::
          vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
          ::operator=((vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
                       *)in_stack_fffffffffffffcc0,
                      (vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
                       *)in_stack_fffffffffffffcb8);
          std::
          vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
          ::~vector((vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
                     *)in_stack_fffffffffffffcc0);
          local_150 = local_150 + 1;
        }
        bVar1 = std::
                vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
                ::empty((vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
                         *)in_stack_fffffffffffffcc0);
        if (!bVar1) {
          pvVar6 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](local_18,0);
          std::__cxx11::string::operator=(local_40,(string *)pvVar6);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](local_18,0);
          approx = is_style_active(in_RDI,allow_guessing);
          is_style_active(in_RDI,long_case_insensitive);
          is_style_active(in_RDI,short_case_insensitive);
          local_170 = options_description::find_nothrow
                                ((options_description *)CONCAT17(uVar12,in_stack_fffffffffffffd40),
                                 in_stack_fffffffffffffd38,(bool)approx,
                                 (bool)in_stack_fffffffffffffd36,(bool)in_stack_fffffffffffffd35);
          if ((option_description *)local_170 != (option_description *)0x0) {
            local_1ba = 1;
            uVar7 = __cxa_allocate_exception(0xc0);
            kVar11 = (kind_t)((ulong)in_stack_fffffffffffffcc8._M_current >> 0x20);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_fffffffffffffcf0,(char *)in_stack_fffffffffffffce8,
                       (allocator<char> *)in_stack_fffffffffffffce0._M_current);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_fffffffffffffcf0,(char *)in_stack_fffffffffffffce8,
                       (allocator<char> *)in_stack_fffffffffffffce0._M_current);
            invalid_command_line_syntax::invalid_command_line_syntax
                      (in_stack_fffffffffffffcd0,kVar11,in_stack_fffffffffffffcc0,
                       in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb4);
            local_1ba = 0;
            __cxa_throw(uVar7,&invalid_command_line_syntax::typeinfo,
                        invalid_command_line_syntax::~invalid_command_line_syntax);
          }
          local_170 = 0;
        }
        in_stack_fffffffffffffcf0 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_10 + 0x28);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](local_18,0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
        in_stack_fffffffffffffce8 = (string *)(local_10 + 0x40);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](local_18,0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
        local_1d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)in_stack_fffffffffffffca8);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
        ::__normal_iterator<std::__cxx11::string*>
                  ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                   (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)in_stack_fffffffffffffca8);
        in_stack_fffffffffffffce0 =
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcc8);
        local_1f9._33_8_ = in_stack_fffffffffffffce0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffcc0);
        std::
        vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
        ::~vector((vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
                   *)in_stack_fffffffffffffcc0);
      }
      local_5c = 0;
    }
    std::__cxx11::string::~string(local_40);
  }
  return;
}

Assistant:

void command_line_parser::finish_option(option& opt,
    std::vector<std::string>& other_tokens,
    const std::vector<style_parser>& style_parsers)
{
    if (opt.string_key.empty())
        return;

    //
    // Be defensive:
    // will have no original token if option created by handle_additional_parser()
    std::string original_token_for_exceptions = opt.string_key;
    if (opt.original_tokens.size())
        original_token_for_exceptions = opt.original_tokens[0];

    try
    {
        // First check that the option is valid, and get its description.
        const option_description* xd = m_options_description->find_nothrow(
            opt.string_key,
            is_style_active(command_line_style::allow_guessing),
            is_style_active(command_line_style::long_case_insensitive),
            is_style_active(command_line_style::short_case_insensitive));

        if (!xd)
        {
            if (m_allow_unregistered) {
                opt.unregistered = true;
                return;
            } else {
                throw unknown_option();
            }
        }
        const option_description& d = *xd;

        // Canonize the name
        opt.string_key = d.key(opt.string_key);

        // We check that the min/max number of tokens for the option
        // agrees with the number of tokens we have. The 'adjacent_value'
        // (the value in --foo=1) counts as a separate token, and if present
        // must be consumed. The following tokens on the command line may be
        // left unconsumed.
        unsigned min_tokens = d.semantic()->min_tokens();
        unsigned max_tokens = d.semantic()->max_tokens();

        unsigned present_tokens = static_cast<unsigned>(opt.value.size() + other_tokens.size());

        if (present_tokens >= min_tokens)
        {
            if (!opt.value.empty() && max_tokens == 0)
            {
                throw invalid_command_line_syntax(invalid_command_line_syntax::extra_parameter);
            }

            // Grab min_tokens values from other_tokens, but only if those tokens
            // are not recognized as options themselves.
            if (opt.value.size() <= min_tokens)
            {
                min_tokens -= static_cast<unsigned>(opt.value.size());
            }
            else
            {
                min_tokens = 0;
            }

            // Everything's OK, move the values to the result.
            for(;!other_tokens.empty() && min_tokens--; )
            {
                // check if extra parameter looks like a known option
                // we use style parsers to check if it is syntactically an option,
                // additionally we check if an option_description exists
                std::vector<option> followed_option;
                std::vector<std::string> next_token(1, other_tokens[0]);
                for (unsigned i = 0; followed_option.empty() && i < style_parsers.size(); ++i)
                {
                    followed_option = style_parsers[i](next_token);
                }
                if (!followed_option.empty())
                {
                    original_token_for_exceptions = other_tokens[0];
                    const option_description* od = m_options_description->find_nothrow(other_tokens[0],
                            is_style_active(command_line_style::allow_guessing),
                            is_style_active(command_line_style::long_case_insensitive),
                            is_style_active(command_line_style::short_case_insensitive));
                    if (od) {
                        throw invalid_command_line_syntax(invalid_command_line_syntax::missing_parameter);
                    }
                }
                opt.value.push_back(other_tokens[0]);
                opt.original_tokens.push_back(other_tokens[0]);
                other_tokens.erase(other_tokens.begin());
            }
        }
        else
        {
            throw invalid_command_line_syntax(invalid_command_line_syntax::missing_parameter);

        }
    }
    // use only original token for unknown_option / ambiguous_option since by definition
    //    they are unrecognised / unparsable
    catch(error_with_option_name& e)
    {
        // add context and rethrow
        e.add_context(opt.string_key, original_token_for_exceptions, get_canonical_option_prefix());
        throw;
    }

}